

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_connect(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  SASL *sasl;
  connectdata *pcVar2;
  char cVar3;
  int iVar4;
  CURLcode CVar5;
  char *value;
  char *pcVar6;
  char *pcVar7;
  size_t len;
  char local_438 [1032];
  
  pcVar2 = data->conn;
  *done = false;
  CVar5 = CURLE_OK;
  Curl_conncontrol(pcVar2,0);
  (pcVar2->proto).smbc.send_buf = (char *)0x1d4c0;
  (pcVar2->proto).ftpc.pp.statemachine = smtp_statemachine;
  (pcVar2->proto).ftpc.pp.endofresp = smtp_endofresp;
  sasl = &(pcVar2->proto).imapc.sasl;
  Curl_sasl_init(sasl,data,&saslsmtp);
  Curl_pp_init(&(pcVar2->proto).ftpc.pp);
  pcVar6 = pcVar2->options;
  while ((CVar5 == CURLE_OK && (pcVar6 != (char *)0x0))) {
    cVar3 = *pcVar6;
    pcVar7 = pcVar6;
    if (cVar3 == '\0') goto LAB_00151558;
    while ((value = pcVar7 + 1, cVar3 != '\0' && (cVar3 != '='))) {
      pcVar7 = value;
      cVar3 = *value;
    }
    len = 0xffffffffffffffff;
    while ((cVar3 != '\0' && (cVar3 != ';'))) {
      pcVar1 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
      len = len + 1;
      cVar3 = *pcVar1;
    }
    iVar4 = curl_strnequal(pcVar6,"AUTH=",5);
    CVar5 = CURLE_URL_MALFORMAT;
    if (iVar4 != 0) {
      CVar5 = Curl_sasl_parse_url_auth_option(sasl,value,len);
    }
    pcVar6 = pcVar7 + (*pcVar7 == ';');
  }
  if (CVar5 == CURLE_OK) {
LAB_00151558:
    pcVar2 = data->conn;
    pcVar6 = (data->state).up.path;
    if (pcVar6[1] == '\0') {
      iVar4 = Curl_gethostname(local_438,0x401);
      pcVar6 = "localhost";
      if (iVar4 == 0) {
        pcVar6 = local_438;
      }
    }
    else {
      pcVar6 = pcVar6 + 1;
    }
    CVar5 = Curl_urldecode(pcVar6,0,&(pcVar2->proto).ftpc.newhost,(size_t *)0x0,REJECT_CTRL);
    if (CVar5 == CURLE_OK) {
      smtp_state(data,SMTP_SERVERGREET);
      CVar5 = smtp_multi_statemach(data,done);
    }
  }
  return CVar5;
}

Assistant:

static CURLcode smtp_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in SMTP */
  connkeep(conn, "SMTP default");

  PINGPONG_SETUP(pp, smtp_statemachine, smtp_endofresp);

  /* Initialize the SASL storage */
  Curl_sasl_init(&smtpc->sasl, data, &saslsmtp);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = smtp_parse_url_options(conn);
  if(result)
    return result;

  /* Parse the URL path */
  result = smtp_parse_url_path(data);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  smtp_state(data, SMTP_SERVERGREET);

  result = smtp_multi_statemach(data, done);

  return result;
}